

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# id_example.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  int iVar2;
  
  iVar2 = base_id<my_id_t>::next_value + 1;
  base_id<my_other_id_t>::next_value = base_id<my_other_id_t>::next_value + 1;
  base_id<my_id_t>::next_value = iVar2;
  poVar1 = std::operator<<((ostream *)&std::cout,"Both of these should show 0 : ");
  std::ostream::operator<<((ostream *)poVar1,iVar2);
  poVar1 = std::operator<<(poVar1,' ');
  std::ostream::operator<<((ostream *)poVar1,iVar2);
  std::operator<<(poVar1,"\n");
  iVar2 = base_id<my_other_id_t>::next_value + 1;
  base_id<my_other_id_t>::next_value = iVar2;
  poVar1 = std::operator<<((ostream *)&std::cout,"This should be 1 : ");
  std::ostream::operator<<((ostream *)poVar1,iVar2);
  std::operator<<(poVar1,"\n");
  return 0;
}

Assistant:

int main() {

    my_id_t id_1 = my_id_t::get_next_id();
    my_other_id_t id_o_1 = my_other_id_t::get_next_id();

    auto id_2 = id_1;

    std::cout << "Both of these should show 0 : " << id_1 << ' ' << id_2 << "\n";

    auto id_o_2 = my_other_id_t::get_next_id();

    std::cout << "This should be 1 : " << id_o_2 << "\n";

    // This should fail to compile
    // id_o_2 = id_1;
}